

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigLoad(Fts5Config *pConfig,int iCookie)

{
  byte bVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  char *zSql;
  uchar *zKey;
  sqlite3_value *pVal;
  i64 iVar3;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  int bDummy;
  int rc;
  sqlite3_stmt *p;
  int local_48;
  int local_44;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)0x0;
  local_44 = 0;
  pConfig->pgsz = 0xfd2;
  pConfig->nAutomerge = 4;
  pConfig->nCrisisMerge = 0x10;
  pConfig->nUsermerge = 4;
  pConfig->nHashSize = 0x100000;
  pConfig->nDeleteMerge = 10;
  uVar5 = 0;
  zSql = sqlite3Fts5Mprintf(&local_44,"SELECT k, v FROM %Q.\'%q_config\'",pConfig->zDb);
  if (zSql != (char *)0x0) {
    local_44 = sqlite3LockAndPrepare(pConfig->db,zSql,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0);
    sqlite3_free(zSql);
  }
  pStmt = local_40;
  if (local_44 == 0) {
    iVar2 = sqlite3_step(local_40);
    uVar5 = 0;
    if (iVar2 == 100) {
      iVar3 = 0;
LAB_001dd95d:
      zKey = sqlite3_column_text(pStmt,0);
      pVal = sqlite3_column_value(pStmt,1);
      if (zKey != (uchar *)0x0) {
        lVar4 = 0;
        do {
          bVar1 = zKey[lVar4];
          if (bVar1 == "schema_version"[lVar4 + 7]) {
            if ((ulong)bVar1 == 0) goto LAB_001dd9bf;
          }
          else if (""[bVar1] != ""[(byte)"schema_version"[lVar4 + 7]]) break;
          lVar4 = lVar4 + 1;
        } while( true );
      }
      local_48 = 0;
      sqlite3Fts5ConfigSetValue(pConfig,(char *)zKey,pVal,&local_48);
      goto LAB_001dd9ca;
    }
LAB_001dd9d7:
    local_44 = sqlite3_finalize(pStmt);
  }
  if ((local_44 == 0) && (uVar5 - 6 < 0xfffffffe)) {
    local_44 = 1;
    sqlite3Fts5ConfigErrmsg
              (pConfig,"invalid fts5 file format (found %d, expected %d or %d) - run \'rebuild\'",
               (ulong)uVar5,4,5);
  }
  else {
    pConfig->iVersion = uVar5;
  }
  if (local_44 == 0) {
    pConfig->iCookie = iCookie;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_44;
  }
  __stack_chk_fail();
LAB_001dd9bf:
  iVar3 = sqlite3VdbeIntValue(pVal);
LAB_001dd9ca:
  uVar5 = (uint)iVar3;
  iVar2 = sqlite3_step(pStmt);
  if (iVar2 != 100) goto LAB_001dd9d7;
  goto LAB_001dd95d;
}

Assistant:

static int sqlite3Fts5ConfigLoad(Fts5Config *pConfig, int iCookie){
  const char *zSelect = "SELECT k, v FROM %Q.'%q_config'";
  char *zSql;
  sqlite3_stmt *p = 0;
  int rc = SQLITE_OK;
  int iVersion = 0;

  /* Set default values */
  pConfig->pgsz = FTS5_DEFAULT_PAGE_SIZE;
  pConfig->nAutomerge = FTS5_DEFAULT_AUTOMERGE;
  pConfig->nUsermerge = FTS5_DEFAULT_USERMERGE;
  pConfig->nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
  pConfig->nHashSize = FTS5_DEFAULT_HASHSIZE;
  pConfig->nDeleteMerge = FTS5_DEFAULT_DELETE_AUTOMERGE;

  zSql = sqlite3Fts5Mprintf(&rc, zSelect, pConfig->zDb, pConfig->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &p, 0);
    sqlite3_free(zSql);
  }

  assert( rc==SQLITE_OK || p==0 );
  if( rc==SQLITE_OK ){
    while( SQLITE_ROW==sqlite3_step(p) ){
      const char *zK = (const char*)sqlite3_column_text(p, 0);
      sqlite3_value *pVal = sqlite3_column_value(p, 1);
      if( 0==sqlite3_stricmp(zK, "version") ){
        iVersion = sqlite3_value_int(pVal);
      }else{
        int bDummy = 0;
        sqlite3Fts5ConfigSetValue(pConfig, zK, pVal, &bDummy);
      }
    }
    rc = sqlite3_finalize(p);
  }

  if( rc==SQLITE_OK
   && iVersion!=FTS5_CURRENT_VERSION
   && iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE
  ){
    rc = SQLITE_ERROR;
    sqlite3Fts5ConfigErrmsg(pConfig, "invalid fts5 file format "
        "(found %d, expected %d or %d) - run 'rebuild'",
        iVersion, FTS5_CURRENT_VERSION, FTS5_CURRENT_VERSION_SECUREDELETE
    );
  }else{
    pConfig->iVersion = iVersion;
  }

  if( rc==SQLITE_OK ){
    pConfig->iCookie = iCookie;
  }
  return rc;
}